

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::
RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UnsafeArenaExtractSubrange
          (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int start,int num,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **elements)

{
  int iVar1;
  uint uVar2;
  Rep *pRVar3;
  void **ppvVar4;
  string *psVar5;
  RepeatedPtrFieldBase *this_00;
  RepeatedPtrFieldBase *this_01;
  ulong uVar6;
  long lVar7;
  RepeatedPtrFieldBase *pRVar8;
  ulong uVar9;
  LogMessageFatal aLStack_90 [16];
  RepeatedPtrFieldBase *pRStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **ppbStack_78;
  long lStack_70;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRStack_68;
  RepeatedPtrFieldBase RStack_58;
  ulong uStack_40;
  
  if (start < 0) {
    uStack_40 = 0x2fa1ef;
    psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)start,0,"start >= 0");
  }
  else {
    psVar5 = (string *)0x0;
  }
  if (psVar5 == (string *)0x0) {
    if (num < 0) {
      uStack_40 = 0x2fa205;
      psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)num,0,"num >= 0");
    }
    else {
      psVar5 = (string *)0x0;
    }
    if (psVar5 == (string *)0x0) {
      iVar1 = (this->super_RepeatedPtrFieldBase).current_size_;
      if (iVar1 < num + start) {
        uStack_40 = 0x2fa219;
        psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                           ((long)(num + start),(long)iVar1,"start + num <= size()");
      }
      else {
        psVar5 = (string *)0x0;
      }
      if (psVar5 == (string *)0x0) {
        if (0 < num) {
          if (elements != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0)
          {
            ppvVar4 = (void **)this;
            if (((ulong)(this->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
              uStack_40 = 0x2fa1a1;
              pRVar3 = internal::RepeatedPtrFieldBase::rep(&this->super_RepeatedPtrFieldBase);
              ppvVar4 = pRVar3->elements;
            }
            uStack_40 = 0x2fa1ba;
            memcpy(elements,ppvVar4 + start,(ulong)(uint)num << 3);
          }
          google::protobuf::internal::RepeatedPtrFieldBase::CloseGap((int)this,start);
          return;
        }
        return;
      }
      goto LAB_002fa238;
    }
  }
  else {
    uStack_40 = 0x2fa22b;
    RepeatedPtrField<std::__cxx11::string>::UnsafeArenaExtractSubrange();
  }
  uStack_40 = 0x2fa238;
  RepeatedPtrField<std::__cxx11::string>::UnsafeArenaExtractSubrange();
LAB_002fa238:
  this_00 = (RepeatedPtrFieldBase *)&stack0xffffffffffffffd0;
  uStack_40 = 0x2fa245;
  RepeatedPtrField<std::__cxx11::string>::UnsafeArenaExtractSubrange();
  iVar1 = this_00->current_size_;
  lVar7 = (long)iVar1;
  RStack_58.arena_ = (Arena *)(ulong)(uint)num;
  uStack_40 = (ulong)(uint)start;
  if (lVar7 < 0) {
    pRStack_68 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x2fa28d;
    psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>(lVar7,0,"n >= 0");
  }
  else {
    psVar5 = (string *)0x0;
  }
  if (psVar5 == (string *)0x0) {
    if (0 < iVar1) {
      internal::RepeatedPtrFieldBase::
      ClearNonEmpty<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                (this_00);
      return;
    }
    return;
  }
  this_01 = &RStack_58;
  pRStack_68 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)internal::RepeatedPtrFieldBase::
                  ClearNonEmpty<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
  ;
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>();
  uVar2 = this_01->current_size_;
  pRVar8 = this_01;
  pRStack_80 = this_00;
  ppbStack_78 = elements;
  lStack_70 = lVar7;
  pRStack_68 = this;
  if (((ulong)this_01->tagged_rep_or_elem_ & 1) != 0) {
    pRVar3 = internal::RepeatedPtrFieldBase::rep(this_01);
    pRVar8 = (RepeatedPtrFieldBase *)pRVar3->elements;
  }
  if ((int)uVar2 < 1) {
    psVar5 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)(int)uVar2,0,"n > 0");
  }
  else {
    psVar5 = (string *)0x0;
  }
  if (psVar5 == (string *)0x0) {
    uVar6 = 1;
    if (1 < (int)uVar2) {
      uVar6 = (ulong)uVar2;
    }
    uVar9 = 0;
    do {
      ppvVar4 = &pRVar8->tagged_rep_or_elem_ + uVar9;
      uVar9 = uVar9 + 1;
      (**(code **)(**ppvVar4 + 0x10))();
    } while (uVar6 != uVar9);
    this_01->current_size_ = 0;
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_90,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
             ,0x2a8,*(undefined8 *)(psVar5 + 8),*(undefined8 *)psVar5);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_90);
}

Assistant:

inline void RepeatedPtrField<Element>::UnsafeArenaExtractSubrange(
    int start, int num, Element** elements) {
  ABSL_DCHECK_GE(start, 0);
  ABSL_DCHECK_GE(num, 0);
  ABSL_DCHECK_LE(start + num, size());

  if (num > 0) {
    // Save the values of the removed elements if requested.
    if (elements != nullptr) {
      memcpy(elements, data() + start, num * sizeof(Element*));
    }
    CloseGap(start, num);
  }
}